

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int backupOnePage(sqlite3_backup *p,Pgno iSrcPg,u8 *zSrcData,int bUpdate)

{
  u32 uVar1;
  u32 uVar2;
  BtShared *pBVar3;
  int iVar4;
  long lVar5;
  void *__dest;
  uint uVar6;
  long lVar7;
  long lVar8;
  DbPage *pDestPg;
  DbPage *local_60;
  int local_54;
  size_t local_50;
  long local_48;
  u8 *local_40;
  Pager *local_38;
  
  pBVar3 = p->pDest->pBt;
  uVar1 = p->pSrc->pBt->pageSize;
  local_48 = (long)(int)uVar1;
  uVar2 = pBVar3->pageSize;
  lVar5 = (long)(int)uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar2 = uVar1;
  }
  local_38 = pBVar3->pPager;
  lVar7 = (ulong)iSrcPg * local_48;
  local_50 = (size_t)(int)uVar2;
  iVar4 = 0;
  local_54 = bUpdate;
  local_40 = zSrcData;
  for (lVar8 = lVar7 - local_48; (iVar4 == 0 && (lVar8 < lVar7)); lVar8 = lVar8 + lVar5) {
    local_60 = (PgHdr *)0x0;
    iVar4 = 0;
    uVar6 = (uint)(lVar8 / lVar5);
    if ((uint)sqlite3PendingByte / p->pDest->pBt->pageSize != uVar6) {
      iVar4 = (*local_38->xGet)(local_38,uVar6 + 1,&local_60,0);
      if ((iVar4 == 0) && (iVar4 = sqlite3PagerWrite(local_60), iVar4 == 0)) {
        __dest = (void *)(lVar8 % lVar5 + (long)local_60->pData);
        memcpy(__dest,local_40 + lVar8 % local_48,local_50);
        *(undefined1 *)local_60->pExtra = 0;
        iVar4 = 0;
        if ((local_54 == 0) && (iVar4 = 0, lVar8 == 0)) {
          uVar6 = p->pSrc->pBt->nPage;
          *(uint *)((long)__dest + 0x1c) =
               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        }
      }
      sqlite3PagerUnref(local_60);
    }
  }
  return iVar4;
}

Assistant:

static int backupOnePage(
  sqlite3_backup *p,              /* Backup handle */
  Pgno iSrcPg,                    /* Source database page to backup */
  const u8 *zSrcData,             /* Source database page data */
  int bUpdate                     /* True for an update, false otherwise */
){
  Pager * const pDestPager = sqlite3BtreePager(p->pDest);
  const int nSrcPgsz = sqlite3BtreeGetPageSize(p->pSrc);
  int nDestPgsz = sqlite3BtreeGetPageSize(p->pDest);
  const int nCopy = MIN(nSrcPgsz, nDestPgsz);
  const i64 iEnd = (i64)iSrcPg*(i64)nSrcPgsz;
  int rc = SQLITE_OK;
  i64 iOff;

  assert( sqlite3BtreeGetReserveNoMutex(p->pSrc)>=0 );
  assert( p->bDestLocked );
  assert( !isFatalError(p->rc) );
  assert( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) );
  assert( zSrcData );
  assert( nSrcPgsz==nDestPgsz || sqlite3PagerIsMemdb(pDestPager)==0 );

  /* This loop runs once for each destination page spanned by the source
  ** page. For each iteration, variable iOff is set to the byte offset
  ** of the destination page.
  */
  for(iOff=iEnd-(i64)nSrcPgsz; rc==SQLITE_OK && iOff<iEnd; iOff+=nDestPgsz){
    DbPage *pDestPg = 0;
    Pgno iDest = (Pgno)(iOff/nDestPgsz)+1;
    if( iDest==PENDING_BYTE_PAGE(p->pDest->pBt) ) continue;
    if( SQLITE_OK==(rc = sqlite3PagerGet(pDestPager, iDest, &pDestPg, 0))
     && SQLITE_OK==(rc = sqlite3PagerWrite(pDestPg))
    ){
      const u8 *zIn = &zSrcData[iOff%nSrcPgsz];
      u8 *zDestData = sqlite3PagerGetData(pDestPg);
      u8 *zOut = &zDestData[iOff%nDestPgsz];

      /* Copy the data from the source page into the destination page.
      ** Then clear the Btree layer MemPage.isInit flag. Both this module
      ** and the pager code use this trick (clearing the first byte
      ** of the page 'extra' space to invalidate the Btree layers
      ** cached parse of the page). MemPage.isInit is marked
      ** "MUST BE FIRST" for this purpose.
      */
      memcpy(zOut, zIn, nCopy);
      ((u8 *)sqlite3PagerGetExtra(pDestPg))[0] = 0;
      if( iOff==0 && bUpdate==0 ){
        sqlite3Put4byte(&zOut[28], sqlite3BtreeLastPage(p->pSrc));
      }
    }
    sqlite3PagerUnref(pDestPg);
  }

  return rc;
}